

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O2

void __thiscall
cfd::TransactionContext::AddTapScriptSign
          (TransactionContext *this,OutPoint *outpoint,TaprootScriptTree *tree,
          SchnorrPubkey *internal_pubkey,
          vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *sign_data_list,
          ByteData *annex)

{
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> sign_params;
  ByteData control;
  Script script;
  
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::vector
            (&sign_params,sign_data_list);
  cfd::core::TaprootUtil::CreateTapScriptControl
            ((SchnorrPubkey *)&control,(TapBranch *)internal_pubkey,(SchnorrPubkey *)tree,
             (Script *)0x0);
  cfd::core::TapBranch::GetScript();
  std::vector<cfd::SignParameter,std::allocator<cfd::SignParameter>>::
  emplace_back<cfd::core::Script&>
            ((vector<cfd::SignParameter,std::allocator<cfd::SignParameter>> *)&sign_params,&script);
  std::vector<cfd::SignParameter,std::allocator<cfd::SignParameter>>::
  emplace_back<cfd::core::ByteData&>
            ((vector<cfd::SignParameter,std::allocator<cfd::SignParameter>> *)&sign_params,&control)
  ;
  if (annex != (ByteData *)0x0) {
    std::vector<cfd::SignParameter,std::allocator<cfd::SignParameter>>::
    emplace_back<cfd::core::ByteData_const&>
              ((vector<cfd::SignParameter,std::allocator<cfd::SignParameter>> *)&sign_params,annex);
  }
  TransactionContextUtil::AddSign<cfd::TransactionContext>(this,outpoint,&sign_params,true,true);
  core::Script::~Script(&script);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&control);
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector(&sign_params);
  return;
}

Assistant:

void TransactionContext::AddTapScriptSign(
    const OutPoint& outpoint, const TaprootScriptTree& tree,
    const SchnorrPubkey& internal_pubkey,
    const std::vector<SignParameter>& sign_data_list, const ByteData* annex) {
  std::vector<SignParameter> sign_params = sign_data_list;
  auto control = TaprootUtil::CreateTapScriptControl(internal_pubkey, tree);
  auto script = tree.GetScript();
  sign_params.emplace_back(script);
  sign_params.emplace_back(control);
  if (annex != nullptr) sign_params.emplace_back(*annex);
  AddSign(outpoint, sign_params, true, true);
}